

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sprite.cpp
# Opt level: O0

void __thiscall GLSprite::PutSprite(GLSprite *this,bool translucent)

{
  int local_18;
  int list;
  bool translucent_local;
  GLSprite *this_local;
  
  if ((translucent) || (this->modelframe == (FSpriteModelFrame *)0x0)) {
    local_18 = 6;
  }
  else {
    local_18 = 5;
  }
  GLDrawList::AddSprite(gl_drawinfo->drawlists + local_18,this);
  return;
}

Assistant:

inline void GLSprite::PutSprite(bool translucent)
{
	int list;
	// [BB] Allow models to be drawn in the GLDL_TRANSLUCENT pass.
	if (translucent || !modelframe)
	{
		list = GLDL_TRANSLUCENT;
	}
	else
	{
		list = GLDL_MODELS;
	}
	gl_drawinfo->drawlists[list].AddSprite(this);
}